

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

shared_ptr<aeron::Publication> __thiscall
aeron::ClientConductor::findPublication(ClientConductor *this,int64_t registrationId)

{
  int iVar1;
  int32_t errorCode;
  long *plVar2;
  long lVar3;
  RegistrationException *this_00;
  char *pcVar4;
  longlong lVar5;
  DriverTimeoutException *this_01;
  long lVar6;
  long in_RDX;
  long lVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *plVar8;
  long *__args_2;
  shared_ptr<aeron::Publication> sVar9;
  allocator local_d2;
  allocator local_d1;
  undefined1 local_d0 [32];
  UnsafeBufferPosition publicationLimit;
  string local_90;
  string local_70;
  string local_50;
  
  std::recursive_mutex::lock((recursive_mutex *)&((pthread_mutex_t *)(registrationId + 8))->__data);
  plVar2 = *(long **)(registrationId + 0x38);
  lVar6 = (long)plVar2 - *(long *)(registrationId + 0x30);
  lVar7 = lVar6 % 0x90;
  plVar8 = (long *)(*(long *)(registrationId + 0x30) + 0x120);
  for (lVar3 = lVar6 / 0x90 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    if (plVar8[-0x20] == in_RDX) {
      __args_2 = plVar8 + -0x24;
      goto LAB_00149a3f;
    }
    if (plVar8[-0xe] == in_RDX) {
      __args_2 = plVar8 + -0x12;
      goto LAB_00149a3f;
    }
    __args_2 = plVar8;
    if (plVar8[4] == in_RDX) goto LAB_00149a3f;
    if (plVar8[0x16] == in_RDX) {
      __args_2 = plVar8 + 0x12;
      goto LAB_00149a3f;
    }
    plVar8 = plVar8 + 0x48;
    lVar6 = lVar6 + -0x240;
  }
  lVar3 = lVar6 / 0x90;
  lVar7 = lVar6 % 0x90;
  __args_2 = plVar8 + -0x24;
  if (lVar3 == 1) {
LAB_00149cf3:
    if (__args_2[4] != in_RDX) {
      __args_2 = plVar2;
    }
LAB_00149a3f:
    if (__args_2 != plVar2) {
      std::__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__weak_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)(__args_2 + 0x10),
                 lVar7);
      if (this->_vptr_ClientConductor == (_func_int **)0x0) {
        iVar1 = (int)__args_2[9];
        if (iVar1 == 0) {
          lVar5 = std::function<long_long_()>::operator()
                            ((function<long_long_()> *)(registrationId + 0x1d8));
          if (*(long *)(registrationId + 0x210) + __args_2[8] < lVar5) {
            this_01 = (DriverTimeoutException *)__cxa_allocate_exception(0x48);
            std::__cxx11::to_string(&local_70,*(long *)(registrationId + 0x210));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0,"no response from driver in ",&local_70);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &publicationLimit,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0," ms");
            std::__cxx11::string::string
                      ((string *)&local_90,
                       "std::shared_ptr<Publication> aeron::ClientConductor::findPublication(std::int64_t)"
                       ,&local_d1);
            pcVar4 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                       ,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                                      );
            std::__cxx11::string::string((string *)&local_50,pcVar4,&local_d2);
            util::DriverTimeoutException::DriverTimeoutException
                      (this_01,(string *)&publicationLimit,&local_90,&local_50,0x62);
            __cxa_throw(this_01,&util::DriverTimeoutException::typeinfo,
                        util::SourcedException::~SourcedException);
          }
        }
        else if (iVar1 == 1) {
          publicationLimit.m_id = (int32_t)__args_2[7];
          publicationLimit.m_buffer._vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_0016f998;
          publicationLimit.m_buffer.m_buffer = *(uint8_t **)(*(long *)(registrationId + 0x110) + 8);
          publicationLimit.m_buffer.m_length =
               *(length_t *)(*(long *)(registrationId + 0x110) + 0x10);
          publicationLimit.m_offset = publicationLimit.m_id << 7;
          std::
          make_shared<aeron::Publication,aeron::ClientConductor&,std::__cxx11::string&,long&,long&,int&,int&,aeron::concurrent::status::UnsafeBufferPosition&,int&,std::shared_ptr<aeron::LogBuffers>&>
                    ((ClientConductor *)local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     registrationId,__args_2,__args_2 + 4,(int *)(__args_2 + 5),
                     (int *)(__args_2 + 6),(UnsafeBufferPosition *)((long)__args_2 + 0x34),
                     (int *)&publicationLimit,
                     (shared_ptr<aeron::LogBuffers> *)((long)__args_2 + 0x3c));
          std::__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)this,
                     (__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)local_d0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
          std::__weak_ptr<aeron::Publication,(__gnu_cxx::_Lock_policy)2>::
          __weak_ptr<aeron::Publication,void>
                    ((__weak_ptr<aeron::Publication,(__gnu_cxx::_Lock_policy)2> *)local_d0,
                     (__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)this);
          std::__weak_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__weak_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)(__args_2 + 0x10)
                     ,(__weak_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)local_d0);
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
        }
        else if (iVar1 == 2) {
          this_00 = (RegistrationException *)__cxa_allocate_exception(0x50);
          errorCode = *(int32_t *)((long)__args_2 + 0x4c);
          std::__cxx11::string::string
                    ((string *)&publicationLimit,
                     "std::shared_ptr<Publication> aeron::ClientConductor::findPublication(std::int64_t)"
                     ,(allocator *)&local_70);
          pcVar4 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                     ,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                                    );
          std::__cxx11::string::string((string *)local_d0,pcVar4,(allocator *)&local_90);
          util::RegistrationException::RegistrationException
                    (this_00,errorCode,(string *)(__args_2 + 10),(string *)&publicationLimit,
                     (string *)local_d0,0x73);
          __cxa_throw(this_00,&util::RegistrationException::typeinfo,
                      util::SourcedException::~SourcedException);
        }
      }
      goto LAB_00149b1b;
    }
  }
  else {
    if (lVar3 == 3) {
      if (plVar8[-0x20] != in_RDX) {
        __args_2 = plVar8 + -0x12;
        goto LAB_00149ce1;
      }
      goto LAB_00149a3f;
    }
    if (lVar3 == 2) {
LAB_00149ce1:
      if (__args_2[4] != in_RDX) {
        __args_2 = __args_2 + 0x12;
        goto LAB_00149cf3;
      }
      goto LAB_00149a3f;
    }
  }
  this->_vptr_ClientConductor = (_func_int **)0x0;
  (this->m_adminLock).super___recursive_mutex_base._M_mutex.__align = 0;
LAB_00149b1b:
  pthread_mutex_unlock((pthread_mutex_t *)(registrationId + 8));
  sVar9.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar9.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::Publication>)
         sVar9.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Publication> ClientConductor::findPublication(std::int64_t registrationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_publications.begin(), m_publications.end(),
        [registrationId](const PublicationStateDefn &entry)
        {
            return (registrationId == entry.m_registrationId);
        });

    if (it == m_publications.end())
    {
        return std::shared_ptr<Publication>();
    }

    PublicationStateDefn& state = (*it);
    std::shared_ptr<Publication> pub(state.m_publication.lock());

    if (!pub)
    {
        switch (state.m_status)
        {
            case RegistrationStatus::AWAITING_MEDIA_DRIVER:
                if (m_epochClock() > (state.m_timeOfRegistration + m_driverTimeoutMs))
                {
                    throw DriverTimeoutException(
                        "no response from driver in " + std::to_string(m_driverTimeoutMs) +" ms", SOURCEINFO);
                }
                break;

            case RegistrationStatus::REGISTERED_MEDIA_DRIVER:
            {
                UnsafeBufferPosition publicationLimit(m_counterValuesBuffer, state.m_publicationLimitCounterId);

                pub = std::make_shared<Publication>(
                    *this, state.m_channel, state.m_registrationId, state.m_originalRegistrationId,
                    state.m_streamId, state.m_sessionId, publicationLimit, state.m_channelStatusId, state.m_buffers);

                state.m_publication = std::weak_ptr<Publication>(pub);
                break;
            }

            case RegistrationStatus::ERRORED_MEDIA_DRIVER:
                throw RegistrationException(state.m_errorCode, state.m_errorMessage, SOURCEINFO);
        }
    }

    return pub;
}